

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManStop(Gia_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  word *pwVar3;
  float *pfVar4;
  Vec_Vec_t *__ptr;
  void *pvVar5;
  void **__ptr_00;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  
  Gia_DatFree(p->pUData);
  pVVar1 = p->vSeqModelVec;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar8 = 0;
      do {
        if ((void *)0x2 < pVVar1->pArray[lVar8]) {
          free(pVVar1->pArray[lVar8]);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  Gia_ManStaticFanoutStop(p);
  Tim_ManStopP((Tim_Man_t **)&p->pManTime);
  if (p->pManTime == (void *)0x0) {
    pVVar1 = p->vNamesIn;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (0 < pVVar1->nSize) {
        lVar8 = 0;
        do {
          if ((void *)0x2 < pVVar1->pArray[lVar8]) {
            free(pVVar1->pArray[lVar8]);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar1->nSize);
      }
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = p->vNamesOut;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (0 < pVVar1->nSize) {
        lVar8 = 0;
        do {
          if ((void *)0x2 < pVVar1->pArray[lVar8]) {
            free(pVVar1->pArray[lVar8]);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar1->nSize);
      }
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    if (p->vSwitching != (Vec_Int_t *)0x0) {
      piVar2 = p->vSwitching->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vSwitching->pArray = (int *)0x0;
      }
      if (p->vSwitching != (Vec_Int_t *)0x0) {
        free(p->vSwitching);
        p->vSwitching = (Vec_Int_t *)0x0;
      }
    }
    if (p->vSuper != (Vec_Int_t *)0x0) {
      piVar2 = p->vSuper->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vSuper->pArray = (int *)0x0;
      }
      if (p->vSuper != (Vec_Int_t *)0x0) {
        free(p->vSuper);
        p->vSuper = (Vec_Int_t *)0x0;
      }
    }
    if (p->vStore != (Vec_Int_t *)0x0) {
      piVar2 = p->vStore->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vStore->pArray = (int *)0x0;
      }
      if (p->vStore != (Vec_Int_t *)0x0) {
        free(p->vStore);
        p->vStore = (Vec_Int_t *)0x0;
      }
    }
    if (p->vClassNew != (Vec_Int_t *)0x0) {
      piVar2 = p->vClassNew->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vClassNew->pArray = (int *)0x0;
      }
      if (p->vClassNew != (Vec_Int_t *)0x0) {
        free(p->vClassNew);
        p->vClassNew = (Vec_Int_t *)0x0;
      }
    }
    if (p->vClassOld != (Vec_Int_t *)0x0) {
      piVar2 = p->vClassOld->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vClassOld->pArray = (int *)0x0;
      }
      if (p->vClassOld != (Vec_Int_t *)0x0) {
        free(p->vClassOld);
        p->vClassOld = (Vec_Int_t *)0x0;
      }
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vSims->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vSims->pArray = (word *)0x0;
      }
      if (p->vSims != (Vec_Wrd_t *)0x0) {
        free(p->vSims);
        p->vSims = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vSimsT != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vSimsT->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vSimsT->pArray = (word *)0x0;
      }
      if (p->vSimsT != (Vec_Wrd_t *)0x0) {
        free(p->vSimsT);
        p->vSimsT = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vSimsPi->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vSimsPi->pArray = (word *)0x0;
      }
      if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
        free(p->vSimsPi);
        p->vSimsPi = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vSimsPo != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vSimsPo->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vSimsPo->pArray = (word *)0x0;
      }
      if (p->vSimsPo != (Vec_Wrd_t *)0x0) {
        free(p->vSimsPo);
        p->vSimsPo = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vTimeStamps != (Vec_Int_t *)0x0) {
      piVar2 = p->vTimeStamps->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vTimeStamps->pArray = (int *)0x0;
      }
      if (p->vTimeStamps != (Vec_Int_t *)0x0) {
        free(p->vTimeStamps);
        p->vTimeStamps = (Vec_Int_t *)0x0;
      }
    }
    if (p->vTiming != (Vec_Flt_t *)0x0) {
      pfVar4 = p->vTiming->pArray;
      if (pfVar4 != (float *)0x0) {
        free(pfVar4);
        p->vTiming->pArray = (float *)0x0;
      }
      if (p->vTiming != (Vec_Flt_t *)0x0) {
        free(p->vTiming);
        p->vTiming = (Vec_Flt_t *)0x0;
      }
    }
    __ptr = p->vClockDoms;
    if (__ptr != (Vec_Vec_t *)0x0) {
      if (0 < __ptr->nSize) {
        lVar8 = 0;
        do {
          pvVar5 = __ptr->pArray[lVar8];
          if (pvVar5 != (void *)0x0) {
            if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar5 + 8));
              *(undefined8 *)((long)pvVar5 + 8) = 0;
            }
            free(pvVar5);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < __ptr->nSize);
      }
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      free(__ptr);
      p->vClockDoms = (Vec_Vec_t *)0x0;
    }
    if (p->vCofVars != (Vec_Int_t *)0x0) {
      piVar2 = p->vCofVars->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCofVars->pArray = (int *)0x0;
      }
      if (p->vCofVars != (Vec_Int_t *)0x0) {
        free(p->vCofVars);
        p->vCofVars = (Vec_Int_t *)0x0;
      }
    }
    if (p->vIdsOrig != (Vec_Int_t *)0x0) {
      piVar2 = p->vIdsOrig->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vIdsOrig->pArray = (int *)0x0;
      }
      if (p->vIdsOrig != (Vec_Int_t *)0x0) {
        free(p->vIdsOrig);
        p->vIdsOrig = (Vec_Int_t *)0x0;
      }
    }
    if (p->vIdsEquiv != (Vec_Int_t *)0x0) {
      piVar2 = p->vIdsEquiv->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vIdsEquiv->pArray = (int *)0x0;
      }
      if (p->vIdsEquiv != (Vec_Int_t *)0x0) {
        free(p->vIdsEquiv);
        p->vIdsEquiv = (Vec_Int_t *)0x0;
      }
    }
    if (p->vLutConfigs != (Vec_Int_t *)0x0) {
      piVar2 = p->vLutConfigs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vLutConfigs->pArray = (int *)0x0;
      }
      if (p->vLutConfigs != (Vec_Int_t *)0x0) {
        free(p->vLutConfigs);
        p->vLutConfigs = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
      piVar2 = p->vEdgeDelay->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vEdgeDelay->pArray = (int *)0x0;
      }
      if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
        free(p->vEdgeDelay);
        p->vEdgeDelay = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdgeDelayR != (Vec_Int_t *)0x0) {
      piVar2 = p->vEdgeDelayR->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vEdgeDelayR->pArray = (int *)0x0;
      }
      if (p->vEdgeDelayR != (Vec_Int_t *)0x0) {
        free(p->vEdgeDelayR);
        p->vEdgeDelayR = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      piVar2 = p->vEdge1->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vEdge1->pArray = (int *)0x0;
      }
      if (p->vEdge1 != (Vec_Int_t *)0x0) {
        free(p->vEdge1);
        p->vEdge1 = (Vec_Int_t *)0x0;
      }
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      piVar2 = p->vEdge2->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vEdge2->pArray = (int *)0x0;
      }
      if (p->vEdge2 != (Vec_Int_t *)0x0) {
        free(p->vEdge2);
        p->vEdge2 = (Vec_Int_t *)0x0;
      }
    }
    if (p->vUserPiIds != (Vec_Int_t *)0x0) {
      piVar2 = p->vUserPiIds->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vUserPiIds->pArray = (int *)0x0;
      }
      if (p->vUserPiIds != (Vec_Int_t *)0x0) {
        free(p->vUserPiIds);
        p->vUserPiIds = (Vec_Int_t *)0x0;
      }
    }
    if (p->vUserPoIds != (Vec_Int_t *)0x0) {
      piVar2 = p->vUserPoIds->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vUserPoIds->pArray = (int *)0x0;
      }
      if (p->vUserPoIds != (Vec_Int_t *)0x0) {
        free(p->vUserPoIds);
        p->vUserPoIds = (Vec_Int_t *)0x0;
      }
    }
    if (p->vUserFfIds != (Vec_Int_t *)0x0) {
      piVar2 = p->vUserFfIds->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vUserFfIds->pArray = (int *)0x0;
      }
      if (p->vUserFfIds != (Vec_Int_t *)0x0) {
        free(p->vUserFfIds);
        p->vUserFfIds = (Vec_Int_t *)0x0;
      }
    }
    if (p->vFlopClasses != (Vec_Int_t *)0x0) {
      piVar2 = p->vFlopClasses->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vFlopClasses->pArray = (int *)0x0;
      }
      if (p->vFlopClasses != (Vec_Int_t *)0x0) {
        free(p->vFlopClasses);
        p->vFlopClasses = (Vec_Int_t *)0x0;
      }
    }
    if (p->vGateClasses != (Vec_Int_t *)0x0) {
      piVar2 = p->vGateClasses->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vGateClasses->pArray = (int *)0x0;
      }
      if (p->vGateClasses != (Vec_Int_t *)0x0) {
        free(p->vGateClasses);
        p->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    if (p->vObjClasses != (Vec_Int_t *)0x0) {
      piVar2 = p->vObjClasses->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vObjClasses->pArray = (int *)0x0;
      }
      if (p->vObjClasses != (Vec_Int_t *)0x0) {
        free(p->vObjClasses);
        p->vObjClasses = (Vec_Int_t *)0x0;
      }
    }
    if (p->vInitClasses != (Vec_Int_t *)0x0) {
      piVar2 = p->vInitClasses->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vInitClasses->pArray = (int *)0x0;
      }
      if (p->vInitClasses != (Vec_Int_t *)0x0) {
        free(p->vInitClasses);
        p->vInitClasses = (Vec_Int_t *)0x0;
      }
    }
    if (p->vRegClasses != (Vec_Int_t *)0x0) {
      piVar2 = p->vRegClasses->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vRegClasses->pArray = (int *)0x0;
      }
      if (p->vRegClasses != (Vec_Int_t *)0x0) {
        free(p->vRegClasses);
        p->vRegClasses = (Vec_Int_t *)0x0;
      }
    }
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      piVar2 = p->vRegInits->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vRegInits->pArray = (int *)0x0;
      }
      if (p->vRegInits != (Vec_Int_t *)0x0) {
        free(p->vRegInits);
        p->vRegInits = (Vec_Int_t *)0x0;
      }
    }
    if (p->vDoms != (Vec_Int_t *)0x0) {
      piVar2 = p->vDoms->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vDoms->pArray = (int *)0x0;
      }
      if (p->vDoms != (Vec_Int_t *)0x0) {
        free(p->vDoms);
        p->vDoms = (Vec_Int_t *)0x0;
      }
    }
    if (p->vBarBufs != (Vec_Int_t *)0x0) {
      piVar2 = p->vBarBufs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vBarBufs->pArray = (int *)0x0;
      }
      if (p->vBarBufs != (Vec_Int_t *)0x0) {
        free(p->vBarBufs);
        p->vBarBufs = (Vec_Int_t *)0x0;
      }
    }
    if (p->vXors != (Vec_Int_t *)0x0) {
      piVar2 = p->vXors->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vXors->pArray = (int *)0x0;
      }
      if (p->vXors != (Vec_Int_t *)0x0) {
        free(p->vXors);
        p->vXors = (Vec_Int_t *)0x0;
      }
    }
    if (p->vLevels != (Vec_Int_t *)0x0) {
      piVar2 = p->vLevels->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vLevels->pArray = (int *)0x0;
      }
      if (p->vLevels != (Vec_Int_t *)0x0) {
        free(p->vLevels);
        p->vLevels = (Vec_Int_t *)0x0;
      }
    }
    if (p->vTruths != (Vec_Int_t *)0x0) {
      piVar2 = p->vTruths->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vTruths->pArray = (int *)0x0;
      }
      if (p->vTruths != (Vec_Int_t *)0x0) {
        free(p->vTruths);
        p->vTruths = (Vec_Int_t *)0x0;
      }
    }
    piVar2 = (p->vCopies).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vCopies).pArray = (int *)0x0;
    }
    (p->vCopies).nCap = 0;
    (p->vCopies).nSize = 0;
    piVar2 = (p->vCopies2).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vCopies2).pArray = (int *)0x0;
    }
    (p->vCopies2).nCap = 0;
    (p->vCopies2).nSize = 0;
    if (p->vVar2Obj != (Vec_Int_t *)0x0) {
      piVar2 = p->vVar2Obj->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vVar2Obj->pArray = (int *)0x0;
      }
      if (p->vVar2Obj != (Vec_Int_t *)0x0) {
        free(p->vVar2Obj);
        p->vVar2Obj = (Vec_Int_t *)0x0;
      }
    }
    piVar2 = (p->vCopiesTwo).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vCopiesTwo).pArray = (int *)0x0;
    }
    (p->vCopiesTwo).nCap = 0;
    (p->vCopiesTwo).nSize = 0;
    piVar2 = (p->vSuppVars).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vSuppVars).pArray = (int *)0x0;
    }
    (p->vSuppVars).nCap = 0;
    (p->vSuppVars).nSize = 0;
    if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vSuppWords->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vSuppWords->pArray = (word *)0x0;
      }
      if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
        free(p->vSuppWords);
        p->vSuppWords = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vTtNums != (Vec_Int_t *)0x0) {
      piVar2 = p->vTtNums->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vTtNums->pArray = (int *)0x0;
      }
      if (p->vTtNums != (Vec_Int_t *)0x0) {
        free(p->vTtNums);
        p->vTtNums = (Vec_Int_t *)0x0;
      }
    }
    if (p->vTtNodes != (Vec_Int_t *)0x0) {
      piVar2 = p->vTtNodes->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vTtNodes->pArray = (int *)0x0;
      }
      if (p->vTtNodes != (Vec_Int_t *)0x0) {
        free(p->vTtNodes);
        p->vTtNodes = (Vec_Int_t *)0x0;
      }
    }
    if (p->vTtMemory != (Vec_Wrd_t *)0x0) {
      pwVar3 = p->vTtMemory->pArray;
      if (pwVar3 != (word *)0x0) {
        free(pwVar3);
        p->vTtMemory->pArray = (word *)0x0;
      }
      if (p->vTtMemory != (Vec_Wrd_t *)0x0) {
        free(p->vTtMemory);
        p->vTtMemory = (Vec_Wrd_t *)0x0;
      }
    }
    if (p->vTtInputs != (Vec_Ptr_t *)0x0) {
      __ptr_00 = p->vTtInputs->pArray;
      if (__ptr_00 != (void **)0x0) {
        free(__ptr_00);
        p->vTtInputs->pArray = (void **)0x0;
      }
      if (p->vTtInputs != (Vec_Ptr_t *)0x0) {
        free(p->vTtInputs);
        p->vTtInputs = (Vec_Ptr_t *)0x0;
      }
    }
    if (p->vMapping != (Vec_Int_t *)0x0) {
      piVar2 = p->vMapping->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vMapping->pArray = (int *)0x0;
      }
      if (p->vMapping != (Vec_Int_t *)0x0) {
        free(p->vMapping);
        p->vMapping = (Vec_Int_t *)0x0;
      }
    }
    pVVar6 = p->vMapping2;
    if (pVVar6 != (Vec_Wec_t *)0x0) {
      if (0 < pVVar6->nCap) {
        lVar9 = 8;
        lVar8 = 0;
        do {
          pvVar5 = *(void **)((long)&pVVar6->pArray->nCap + lVar9);
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
            *(undefined8 *)((long)&pVVar6->pArray->nCap + lVar9) = 0;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar8 < pVVar6->nCap);
      }
      if (pVVar6->pArray != (Vec_Int_t *)0x0) {
        free(pVVar6->pArray);
        pVVar6->pArray = (Vec_Int_t *)0x0;
      }
      pVVar6->nCap = 0;
      pVVar6->nSize = 0;
      free(pVVar6);
      p->vMapping2 = (Vec_Wec_t *)0x0;
    }
    pVVar6 = p->vFanouts2;
    if (pVVar6 != (Vec_Wec_t *)0x0) {
      if (0 < pVVar6->nCap) {
        lVar9 = 8;
        lVar8 = 0;
        do {
          pvVar5 = *(void **)((long)&pVVar6->pArray->nCap + lVar9);
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
            *(undefined8 *)((long)&pVVar6->pArray->nCap + lVar9) = 0;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar8 < pVVar6->nCap);
      }
      if (pVVar6->pArray != (Vec_Int_t *)0x0) {
        free(pVVar6->pArray);
        pVVar6->pArray = (Vec_Int_t *)0x0;
      }
      pVVar6->nCap = 0;
      pVVar6->nSize = 0;
      free(pVVar6);
      p->vFanouts2 = (Vec_Wec_t *)0x0;
    }
    if (p->vCellMapping != (Vec_Int_t *)0x0) {
      piVar2 = p->vCellMapping->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCellMapping->pArray = (int *)0x0;
      }
      if (p->vCellMapping != (Vec_Int_t *)0x0) {
        free(p->vCellMapping);
        p->vCellMapping = (Vec_Int_t *)0x0;
      }
    }
    if (p->vPacking != (Vec_Int_t *)0x0) {
      piVar2 = p->vPacking->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vPacking->pArray = (int *)0x0;
      }
      if (p->vPacking != (Vec_Int_t *)0x0) {
        free(p->vPacking);
        p->vPacking = (Vec_Int_t *)0x0;
      }
    }
    if (p->vConfigs != (Vec_Int_t *)0x0) {
      piVar2 = p->vConfigs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vConfigs->pArray = (int *)0x0;
      }
      if (p->vConfigs != (Vec_Int_t *)0x0) {
        free(p->vConfigs);
        p->vConfigs = (Vec_Int_t *)0x0;
      }
    }
    if (p->pCellStr != (char *)0x0) {
      free(p->pCellStr);
      p->pCellStr = (char *)0x0;
    }
    if (p->vInArrs != (Vec_Flt_t *)0x0) {
      pfVar4 = p->vInArrs->pArray;
      if (pfVar4 != (float *)0x0) {
        free(pfVar4);
        p->vInArrs->pArray = (float *)0x0;
      }
      if (p->vInArrs != (Vec_Flt_t *)0x0) {
        free(p->vInArrs);
        p->vInArrs = (Vec_Flt_t *)0x0;
      }
    }
    if (p->vOutReqs != (Vec_Flt_t *)0x0) {
      pfVar4 = p->vOutReqs->pArray;
      if (pfVar4 != (float *)0x0) {
        free(pfVar4);
        p->vOutReqs->pArray = (float *)0x0;
      }
      if (p->vOutReqs != (Vec_Flt_t *)0x0) {
        free(p->vOutReqs);
        p->vOutReqs = (Vec_Flt_t *)0x0;
      }
    }
    if (p->vCiArrs != (Vec_Int_t *)0x0) {
      piVar2 = p->vCiArrs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCiArrs->pArray = (int *)0x0;
      }
      if (p->vCiArrs != (Vec_Int_t *)0x0) {
        free(p->vCiArrs);
        p->vCiArrs = (Vec_Int_t *)0x0;
      }
    }
    if (p->vCoReqs != (Vec_Int_t *)0x0) {
      piVar2 = p->vCoReqs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCoReqs->pArray = (int *)0x0;
      }
      if (p->vCoReqs != (Vec_Int_t *)0x0) {
        free(p->vCoReqs);
        p->vCoReqs = (Vec_Int_t *)0x0;
      }
    }
    if (p->vCoArrs != (Vec_Int_t *)0x0) {
      piVar2 = p->vCoArrs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCoArrs->pArray = (int *)0x0;
      }
      if (p->vCoArrs != (Vec_Int_t *)0x0) {
        free(p->vCoArrs);
        p->vCoArrs = (Vec_Int_t *)0x0;
      }
    }
    if (p->vCoAttrs != (Vec_Int_t *)0x0) {
      piVar2 = p->vCoAttrs->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        p->vCoAttrs->pArray = (int *)0x0;
      }
      if (p->vCoAttrs != (Vec_Int_t *)0x0) {
        free(p->vCoAttrs);
        p->vCoAttrs = (Vec_Int_t *)0x0;
      }
    }
    if (p->pAigExtra != (Gia_Man_t *)0x0) {
      Gia_ManStop(p->pAigExtra);
      p->pAigExtra = (Gia_Man_t *)0x0;
    }
    pVVar7 = p->vCis;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    pVVar7 = p->vCos;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    piVar2 = (p->vHash).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vHash).pArray = (int *)0x0;
    }
    (p->vHash).nCap = 0;
    (p->vHash).nSize = 0;
    piVar2 = (p->vHTable).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vHTable).pArray = (int *)0x0;
    }
    (p->vHTable).nCap = 0;
    (p->vHTable).nSize = 0;
    piVar2 = (p->vRefs).pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      (p->vRefs).pArray = (int *)0x0;
    }
    (p->vRefs).nCap = 0;
    (p->vRefs).nSize = 0;
    if (p->pData2 != (uint *)0x0) {
      free(p->pData2);
      p->pData2 = (uint *)0x0;
    }
    if (p->pTravIds != (int *)0x0) {
      free(p->pTravIds);
      p->pTravIds = (int *)0x0;
    }
    if (p->pPlacement != (Gia_Plc_t *)0x0) {
      free(p->pPlacement);
      p->pPlacement = (Gia_Plc_t *)0x0;
    }
    if (p->pSwitching != (uchar *)0x0) {
      free(p->pSwitching);
      p->pSwitching = (uchar *)0x0;
    }
    if (p->pCexSeq != (Abc_Cex_t *)0x0) {
      free(p->pCexSeq);
      p->pCexSeq = (Abc_Cex_t *)0x0;
    }
    if (p->pCexComb != (Abc_Cex_t *)0x0) {
      free(p->pCexComb);
      p->pCexComb = (Abc_Cex_t *)0x0;
    }
    if (p->pIso != (int *)0x0) {
      free(p->pIso);
      p->pIso = (int *)0x0;
    }
    if (p->pFanData != (int *)0x0) {
      free(p->pFanData);
      p->pFanData = (int *)0x0;
    }
    if (p->pReprsOld != (int *)0x0) {
      free(p->pReprsOld);
      p->pReprsOld = (int *)0x0;
    }
    if (p->pReprs != (Gia_Rpr_t *)0x0) {
      free(p->pReprs);
      p->pReprs = (Gia_Rpr_t *)0x0;
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
    if (p->pSibls != (int *)0x0) {
      free(p->pSibls);
      p->pSibls = (int *)0x0;
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    if (p->pLutRefs != (int *)0x0) {
      free(p->pLutRefs);
      p->pLutRefs = (int *)0x0;
    }
    if (p->pMuxes != (uint *)0x0) {
      free(p->pMuxes);
      p->pMuxes = (uint *)0x0;
    }
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      free(p->pObjs);
      p->pObjs = (Gia_Obj_t *)0x0;
    }
    if (p->pSpec != (char *)0x0) {
      free(p->pSpec);
      p->pSpec = (char *)0x0;
    }
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    free(p);
    return;
  }
  __assert_fail("p->pManTime == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                ,0x5a,"void Gia_ManStop(Gia_Man_t *)");
}

Assistant:

void Gia_ManStop( Gia_Man_t * p )
{
    extern void Gia_DatFree( Gia_Dat_t * p );
    Gia_DatFree( p->pUData );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    Gia_ManStaticFanoutStop( p );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    assert( p->pManTime == NULL );
    Vec_PtrFreeFree( p->vNamesIn );
    Vec_PtrFreeFree( p->vNamesOut );
    Vec_IntFreeP( &p->vSwitching );
    Vec_IntFreeP( &p->vSuper );
    Vec_IntFreeP( &p->vStore );
    Vec_IntFreeP( &p->vClassNew );
    Vec_IntFreeP( &p->vClassOld );
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsT );
    Vec_WrdFreeP( &p->vSimsPi );
    Vec_WrdFreeP( &p->vSimsPo );
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_FltFreeP( &p->vTiming );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vCofVars );
    Vec_IntFreeP( &p->vIdsOrig );
    Vec_IntFreeP( &p->vIdsEquiv );
    Vec_IntFreeP( &p->vLutConfigs );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdgeDelayR );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    Vec_IntFreeP( &p->vUserPiIds );
    Vec_IntFreeP( &p->vUserPoIds );
    Vec_IntFreeP( &p->vUserFfIds );
    Vec_IntFreeP( &p->vFlopClasses );
    Vec_IntFreeP( &p->vGateClasses );
    Vec_IntFreeP( &p->vObjClasses );
    Vec_IntFreeP( &p->vInitClasses );
    Vec_IntFreeP( &p->vRegClasses );
    Vec_IntFreeP( &p->vRegInits );
    Vec_IntFreeP( &p->vDoms );
    Vec_IntFreeP( &p->vBarBufs );
    Vec_IntFreeP( &p->vXors );
    Vec_IntFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntErase( &p->vCopies );
    Vec_IntErase( &p->vCopies2 );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntErase( &p->vCopiesTwo );
    Vec_IntErase( &p->vSuppVars );
    Vec_WrdFreeP( &p->vSuppWords );
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_WrdFreeP( &p->vTtMemory );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_IntFreeP( &p->vMapping );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    Vec_IntFreeP( &p->vCellMapping );
    Vec_IntFreeP( &p->vPacking );
    Vec_IntFreeP( &p->vConfigs );
    ABC_FREE( p->pCellStr );
    Vec_FltFreeP( &p->vInArrs );
    Vec_FltFreeP( &p->vOutReqs );
    Vec_IntFreeP( &p->vCiArrs );
    Vec_IntFreeP( &p->vCoReqs );
    Vec_IntFreeP( &p->vCoArrs );
    Vec_IntFreeP( &p->vCoAttrs );
    Gia_ManStopP( &p->pAigExtra );
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    Vec_IntErase( &p->vHash );
    Vec_IntErase( &p->vHTable );
    Vec_IntErase( &p->vRefs );
    ABC_FREE( p->pData2 );
    ABC_FREE( p->pTravIds );
    ABC_FREE( p->pPlacement );
    ABC_FREE( p->pSwitching );
    ABC_FREE( p->pCexSeq );
    ABC_FREE( p->pCexComb );
    ABC_FREE( p->pIso );
//    ABC_FREE( p->pMapping );
    ABC_FREE( p->pFanData );
    ABC_FREE( p->pReprsOld );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    ABC_FREE( p->pSibls );
    ABC_FREE( p->pRefs );
    ABC_FREE( p->pLutRefs );
    ABC_FREE( p->pMuxes );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}